

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values.h
# Opt level: O1

void mpt::apply<mpt::point<double>,double>
               (point<double> *d,linepart *pt,double *src,point<double> *scale)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  double dVar8;
  
  uVar5 = (ulong)pt->usr;
  dVar2 = scale->x;
  dVar3 = scale->y;
  fVar7 = linepart::cut(pt);
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    if (pt->raw < 2) {
      return;
    }
    dVar8 = (src[1] - *src) * (double)fVar7 + *src;
    d->x = dVar2 * dVar8 + d->x;
    d->y = dVar8 * dVar3 + d->y;
    uVar6 = 1;
  }
  else {
    uVar6 = 0;
  }
  fVar7 = linepart::trim(pt);
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    if (pt->raw < 2) {
      return;
    }
    uVar1 = uVar5 - 1;
    dVar8 = (src[uVar5 - 2] - src[uVar5 - 1]) * (double)fVar7 + src[uVar5 - 1];
    d[uVar1].x = dVar2 * dVar8 + d[uVar1].x;
    d[uVar1].y = dVar8 * dVar3 + d[uVar1].y;
    uVar5 = uVar1;
  }
  if (uVar6 < uVar5) {
    pdVar4 = (double *)((long)&d->y + (ulong)(uint)((int)uVar6 << 4));
    do {
      pdVar4[-1] = src[uVar6] * dVar2 + pdVar4[-1];
      *pdVar4 = src[uVar6] * dVar3 + *pdVar4;
      uVar6 = uVar6 + 1;
      pdVar4 = pdVar4 + 2;
    } while (uVar5 != uVar6);
  }
  return;
}

Assistant:

void apply(T *d, const linepart &pt, const S *src, const T &scale)
{
	size_t j = 0, len = pt.usr;
	S sx(scale.x), sy(scale.y), part;
	
	if ((part = pt.cut())) {
		if (pt.raw < 2) {
			return;
		}
		++j;
		S s1 = src[0];
		S s2 = src[1];
		part = s1 + part * (s2 - s1);
		
		d->x += sx * part;
		d->y += sy * part;
	}
	if ((part = pt.trim())) {
		if (pt.raw < 2) {
			return;
		}
		--len;
		S s1 = src[len - 1];
		S s2 = src[len];
		part = s2 + part * (s1 - s2);
		
		d[len].x += sx * part;
		d[len].y += sy * part;
	}
	for ( ; j < len ; j++ ) {
		d[j].x += sx * src[j];
		d[j].y += sy * src[j];
	}
}